

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BondAngleDistribution.cpp
# Opt level: O2

void __thiscall
OpenMD::BondAngleDistribution::BondAngleDistribution
          (BondAngleDistribution *this,SimInfo *info,string *filename,string *sele,double rCut,
          int nbins)

{
  SelectionEvaluator *this_00;
  ostream *poVar1;
  string paramString;
  stringstream params;
  string sStack_1e8;
  string *local_1c8;
  RealType local_1c0;
  undefined1 local_1b8 [392];
  
  local_1c0 = rCut;
  StaticAnalyser::StaticAnalyser(&this->super_StaticAnalyser,info,filename,nbins);
  (this->super_StaticAnalyser)._vptr_StaticAnalyser =
       (_func_int **)&PTR__BondAngleDistribution_002eccd8;
  std::__cxx11::string::string((string *)&this->selectionScript_,(string *)sele);
  local_1c8 = &this->selectionScript_;
  SelectionManager::SelectionManager(&this->seleMan_,info);
  this_00 = &this->evaluator_;
  SelectionEvaluator::SelectionEvaluator(this_00,info);
  (this->histogram_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->histogram_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (this->ThetaCount_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (this->histogram_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->ThetaCount_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->ThetaCount_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_1b8,"Bond Angle Distribution",(allocator<char> *)&sStack_1e8);
  std::__cxx11::string::_M_assign((string *)&(this->super_StaticAnalyser).analysisType_);
  std::__cxx11::string::~string((string *)local_1b8);
  getPrefix(&sStack_1e8,filename);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1b8,
                 &sStack_1e8,".bad");
  std::__cxx11::string::_M_assign((string *)&(this->super_StaticAnalyser).outputFilename_);
  std::__cxx11::string::~string((string *)local_1b8);
  std::__cxx11::string::~string((string *)&sStack_1e8);
  SelectionEvaluator::loadScriptString(this_00,sele);
  if ((this->evaluator_).isDynamic_ == false) {
    SelectionEvaluator::evaluate((SelectionSet *)local_1b8,this_00);
    SelectionManager::setSelectionSet(&this->seleMan_,(SelectionSet *)local_1b8);
    std::vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>::~vector
              ((vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_> *)local_1b8);
  }
  this->rCut_ = local_1c0;
  std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
  std::operator<<((ostream *)(local_1b8 + 0x10)," rcut = ");
  poVar1 = std::ostream::_M_insert<double>(this->rCut_);
  poVar1 = std::operator<<(poVar1,", nbins = ");
  std::ostream::operator<<((ostream *)poVar1,this->nBins_);
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::_M_assign((string *)&(this->super_StaticAnalyser).paramString_);
  this->deltaTheta_ = 180.0 / (double)this->nBins_;
  std::vector<int,_std::allocator<int>_>::resize(&this->histogram_,(long)this->nBins_);
  std::__cxx11::string::~string((string *)&sStack_1e8);
  std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
  return;
}

Assistant:

BondAngleDistribution::BondAngleDistribution(SimInfo* info,
                                               const string& filename,
                                               const string& sele, double rCut,
                                               int nbins) :
      StaticAnalyser(info, filename, nbins),
      selectionScript_(sele), seleMan_(info), evaluator_(info) {
    setAnalysisType("Bond Angle Distribution");
    setOutputName(getPrefix(filename) + ".bad");

    evaluator_.loadScriptString(sele);
    if (!evaluator_.isDynamic()) {
      seleMan_.setSelectionSet(evaluator_.evaluate());
    }

    // Set up cutoff radius:

    rCut_ = rCut;

    std::stringstream params;
    params << " rcut = " << rCut_ << ", nbins = " << nBins_;
    const std::string paramString = params.str();
    setParameterString(paramString);

    // Theta can take values from 0 to 180

    deltaTheta_ = (180.0) / nBins_;
    histogram_.resize(nBins_);
  }